

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O2

ON_wString __thiscall
ON_wString::FormatToVulgarFraction
          (ON_wString *this,int numerator,int denominator,bool bReduced,bool bProper,
          uint proper_fraction_separator_cp,bool bUseVulgarFractionCodePoints)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  ON_wString *this_00;
  ulong uVar7;
  ON__UINT32 u;
  int local_94;
  ON_wString fraction;
  ON_wString local_88;
  ON_wString local_80;
  ON_wString local_78;
  ON_wString local_70;
  ON_wString local_68;
  ON_wString local_60;
  ON_wString local_58;
  ON_wString local_50;
  ON_wString vulgar_fraction;
  ON_wString local_38;
  
  if (denominator == 0) {
    FormatToString((wchar_t *)&local_50,L"%d",(ulong)(uint)numerator);
    ON_wString(&local_58,L"0");
    FormatToVulgarFraction(this,&local_50,&local_58);
    ~ON_wString(&local_58);
    this_00 = &local_50;
    goto LAB_00671dfc;
  }
  if (numerator == 0) {
    if (bReduced) {
      ON_wString(this,L"0");
      return (ON_wString)(wchar_t *)this;
    }
    ON_wString(&local_60,L"0");
    FormatToString((wchar_t *)&local_68,L"%d",(ulong)(uint)denominator);
    FormatToVulgarFraction(this,&local_60,&local_68);
    ~ON_wString(&local_68);
    this_00 = &local_60;
    goto LAB_00671dfc;
  }
  if (bReduced) {
    uVar3 = numerator;
    if (numerator < 1) {
      uVar3 = -numerator;
    }
    if (denominator < 0) {
      numerator = -numerator;
    }
    if (denominator < 1) {
      denominator = -denominator;
    }
    if ((1 < uVar3 && 1 < (uint)denominator) &&
       (uVar3 = ON_GreatestCommonDivisor(uVar3,denominator), 0 < (int)uVar3)) {
      numerator = numerator / (int)uVar3;
      denominator = (uint)denominator / uVar3;
    }
  }
  else if (denominator < 0 && bProper) {
    denominator = -denominator;
    numerator = -numerator;
  }
  uVar3 = -numerator;
  if (0 < numerator) {
    uVar3 = numerator;
  }
  if ((bProper) && (denominator <= (int)uVar3)) {
    uVar1 = (long)numerator / (long)denominator;
    uVar2 = (long)numerator % (long)denominator;
    local_94 = (int)uVar1;
    iVar4 = (int)uVar2;
    uVar7 = (ulong)(uint)-iVar4;
    if (0 < iVar4) {
      uVar7 = uVar2 & 0xffffffff;
    }
    if (numerator == local_94 * denominator) {
      FormatToString((wchar_t *)this,L"%d",uVar1 & 0xffffffff);
      return (ON_wString)(wchar_t *)this;
    }
    if (proper_fraction_separator_cp == 0) {
      proper_fraction_separator_cp = 0;
    }
    else {
      iVar4 = ON_IsValidUnicodeCodePoint(proper_fraction_separator_cp);
      if (iVar4 == 0) {
        proper_fraction_separator_cp = 0;
      }
    }
  }
  else {
    local_94 = 0;
    uVar7 = (ulong)(uint)numerator;
  }
  uVar3 = (uint)uVar7;
  if (!bUseVulgarFractionCodePoints) goto switchD_00671bb4_default;
  uVar5 = -uVar3;
  if (0 < (int)uVar3) {
    uVar5 = uVar3;
  }
  uVar6 = -denominator;
  if (0 < denominator) {
    uVar6 = denominator;
  }
  if (uVar6 <= uVar5) goto switchD_00671bb4_default;
  switch(denominator) {
  case 2:
    u = 0xbd;
    break;
  case 3:
    if (uVar3 == 1) {
      u = 0x2153;
    }
    else {
      if (uVar3 != 2) goto switchD_00671bb4_default;
      u = 0x2154;
    }
    goto LAB_00671c79;
  case 4:
    if (uVar3 == 1) {
      u = 0xbc;
    }
    else {
      if (uVar3 != 3) goto switchD_00671bb4_default;
      u = 0xbe;
    }
    goto LAB_00671c79;
  case 5:
    if (uVar3 - 1 < 4) {
      u = uVar3 + 0x2154;
      goto LAB_00671c79;
    }
    goto switchD_00671bb4_default;
  case 6:
    if (uVar3 == 1) {
      u = 0x2159;
    }
    else {
      if (uVar3 != 5) goto switchD_00671bb4_default;
      u = 0x215a;
    }
    goto LAB_00671c79;
  case 7:
    u = 0x2150;
    break;
  case 8:
    uVar3 = uVar3 - 1;
    if ((uVar3 < 7) && ((0x55U >> (uVar3 & 0x1f) & 1) != 0)) {
      u = *(ON__UINT32 *)(&DAT_006e2f94 + (ulong)uVar3 * 4);
      goto LAB_00671c79;
    }
    goto switchD_00671bb4_default;
  case 9:
    u = 0x2151;
    break;
  case 10:
    u = 0x2152;
    break;
  default:
    goto switchD_00671bb4_default;
  }
  if (uVar3 == 1) {
LAB_00671c79:
    iVar4 = ON_IsValidUnicodeCodePoint(u);
    if (iVar4 != 0) {
      stack0xffffffffffffffbc = 0;
      vulgar_fraction.m_s._0_4_ = u;
      FromUnicodeCodePoints(&fraction,(ON__UINT32 *)&vulgar_fraction,1,0xfffd);
      if (local_94 == 0) {
        ON_wString(this,&fraction);
      }
      else {
        FormatToString((wchar_t *)&local_88,L"%d");
        FromUnicodeCodePoint(&local_70,proper_fraction_separator_cp);
        operator+(&local_80,&local_88);
        operator+(this,&local_80);
        ~ON_wString(&local_80);
        ~ON_wString(&local_70);
        ~ON_wString(&local_88);
      }
      this_00 = &fraction;
      goto LAB_00671dfc;
    }
  }
switchD_00671bb4_default:
  FormatToString((wchar_t *)&local_38,L"%d",uVar7);
  FormatToString((wchar_t *)&local_78,L"%d",(ulong)(uint)denominator);
  FormatToVulgarFraction(&vulgar_fraction,&local_38,&local_78);
  ~ON_wString(&local_78);
  ~ON_wString(&local_38);
  if (local_94 == 0) {
    ON_wString(this,&vulgar_fraction);
  }
  else {
    FormatToString((wchar_t *)&local_80,L"%d");
    FromUnicodeCodePoint(&local_88,proper_fraction_separator_cp);
    operator+(&fraction,&local_80);
    operator+(this,&fraction);
    ~ON_wString(&fraction);
    ~ON_wString(&local_88);
    ~ON_wString(&local_80);
  }
  this_00 = &vulgar_fraction;
LAB_00671dfc:
  ~ON_wString(this_00);
  return (ON_wString)(wchar_t *)this;
}

Assistant:

const ON_wString ON_wString::FormatToVulgarFraction(
  int numerator,
  int denominator,
  bool bReduced,
  bool bProper,
  unsigned proper_fraction_separator_cp,
  bool bUseVulgarFractionCodePoints
)
{
  if (0 == denominator)
  {
    // ... Kids these days!
    return ON_wString::FormatToVulgarFraction(ON_wString::FormatToString(L"%d", numerator), L"0");
  }

  if (0 == numerator)
  {
    if (bReduced)
      return ON_wString(L"0");
    if (bUseVulgarFractionCodePoints && 3 == numerator)
      return ON_wString((wchar_t)0x2189); // Baseball zero for three 0/3 = U+2189

    return ON_wString::FormatToVulgarFraction(L"0", ON_wString::FormatToString(L"%d", denominator));
  }

  if (bReduced || bProper)
  {
    if (denominator < 0)
    {
      denominator = -denominator;
      numerator = -numerator;
    }
  }

  if (bReduced && abs(numerator) > 1 && abs(denominator) > 1)
  {
    const int gcd = (int)ON_GreatestCommonDivisor((unsigned)(abs(numerator)), (unsigned)denominator);
    if (gcd > 0)
    {
      numerator /= gcd;
      denominator /= gcd;
    }
  }

  int n = 0;
  if (bProper && abs(numerator) >= denominator)
  {
    n = numerator / denominator;
    numerator = abs(numerator - (n * denominator));
    if (0 == numerator)
      return ON_wString::FormatToString(L"%d", n);

    if (0 != proper_fraction_separator_cp && false == ON_IsValidUnicodeCodePoint(proper_fraction_separator_cp))
      proper_fraction_separator_cp = 0;
  }

  if (bUseVulgarFractionCodePoints && abs(numerator) < abs(denominator))
  {
    unsigned fraction_cp = 0;
    switch (denominator)
    {
    case 2:
      if (1 == numerator)
        fraction_cp = 0x00BD;
      break;
    case 3:
      if (1 == numerator)
        fraction_cp = 0x2153;
      else if (2 == numerator)
        fraction_cp = 0x2154;
      break;
    case 4:
      if (1 == numerator)
        fraction_cp = 0x00BC;
      else if (3 == numerator)
        fraction_cp = 0x00BE;
      break;
    case 5:
      if (1 == numerator)
        fraction_cp = 0x2155;
      else if (2 == numerator)
        fraction_cp = 0x2156;
      else if (3 == numerator)
        fraction_cp = 0x2157;
      else if (4 == numerator)
        fraction_cp = 0x2158;
      break;
    case 6:
      if (1 == numerator)
        fraction_cp = 0x2159;
      else if (5 == numerator)
        fraction_cp = 0x215A;
      break;
    case 7:
      if (1 == numerator)
        fraction_cp = 0x2150;
      break;
    case 8:
      if (1 == numerator)
        fraction_cp = 0x215B;
      else if (3 == numerator)
        fraction_cp = 0x215C;
      else if (5 == numerator)
        fraction_cp = 0x215D;
      else if (7 == numerator)
        fraction_cp = 0x215E;
      break;
    case 9:
      if (1 == numerator)
        fraction_cp = 0x2151;
      break;
    case 10:
      if (1 == numerator)
        fraction_cp = 0x2152;
      break;
    }

    if (fraction_cp > 0 && ON_IsValidUnicodeCodePoint(fraction_cp))
    {
      unsigned cp[3] = {};
      unsigned cp_count = 0;
      if (0 == n && numerator < 0)
        cp[cp_count++] = ON_UnicodeCodePoint::ON_HyphenMinus;
      cp[cp_count++] = fraction_cp;
      const ON_wString fraction = ON_wString::FromUnicodeCodePoints(cp, cp_count, ON_UnicodeCodePoint::ON_ReplacementCharacter);
      if (0 == n)
        return fraction;
      return ON_wString::FormatToString(L"%d", n)
        + ON_wString::FromUnicodeCodePoint(proper_fraction_separator_cp)
        + fraction;
    }
  }

  const ON_wString vulgar_fraction = ON_wString::FormatToVulgarFraction(ON_wString::FormatToString(L"%d", numerator), ON_wString::FormatToString(L"%d", denominator));
  return
    (0 == n)
    ? vulgar_fraction
    : ON_wString::FormatToString(L"%d", n) + ON_wString::FromUnicodeCodePoint(proper_fraction_separator_cp) + vulgar_fraction;
}